

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coded_stream_unittest.cc
# Opt level: O1

void __thiscall
google::protobuf::io::(anonymous_namespace)::Fixed64Cases_ReadLittleEndian64FromArray_Test::
~Fixed64Cases_ReadLittleEndian64FromArray_Test(Fixed64Cases_ReadLittleEndian64FromArray_Test *this)

{
  testing::Test::~Test((Test *)(this + -0x10));
  operator_delete((Test *)(this + -0x10),0x18);
  return;
}

Assistant:

TEST_P(Fixed64Cases, ReadLittleEndian64FromArray) {
  Fixed64Case kFixed64Cases_case = GetParam();
  memcpy(buffer_, kFixed64Cases_case.bytes, sizeof(kFixed64Cases_case.bytes));

  uint64_t value;
  const uint8_t* end =
      CodedInputStream::ReadLittleEndian64FromArray(buffer_, &value);
  EXPECT_EQ(kFixed64Cases_case.value, value);
  EXPECT_TRUE(end == buffer_ + sizeof(value));
}